

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.c
# Opt level: O0

void QuickSort(int *sort,int start,int end)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int baseval;
  int j;
  int i;
  int end_local;
  int start_local;
  int *sort_local;
  
  if (start < end) {
    iVar1 = sort[start];
    local_20 = end;
    baseval = start;
    while (baseval < local_20) {
      while( true ) {
        bVar2 = false;
        if (baseval < local_20) {
          bVar2 = iVar1 <= sort[local_20];
        }
        if (!bVar2) break;
        local_20 = local_20 + -1;
      }
      if (baseval < local_20) {
        sort[baseval] = sort[local_20];
        baseval = baseval + 1;
      }
      while( true ) {
        bVar2 = false;
        if (baseval < local_20) {
          bVar2 = sort[baseval] < iVar1;
        }
        if (!bVar2) break;
        baseval = baseval + 1;
      }
      if (baseval < local_20) {
        sort[local_20] = sort[baseval];
        local_20 = local_20 + -1;
      }
    }
    sort[baseval] = iVar1;
    QuickSort(sort,start,baseval + -1);
    QuickSort(sort,baseval + 1,end);
  }
  return;
}

Assistant:

void QuickSort(int sort[],int start,int end){
    if(start >= end)
        return;
    int i = start;
    int j = end;
    int baseval = sort[start];
    while(i < j){
        //从右往左找比基准数小的数
        while(i < j && sort[j] >= baseval){
            j--;
        }
        if(i < j){      //交换
            sort[i] = sort[j];
            i++;        //减少一次寻找比基准数大的数
        }
        //从左往右找比基准数大的数
        while(i < j && sort[i] < baseval){
            i++;
        }
        if(i < j){      //交换
            sort[j] = sort[i];
            j--;    //减少一次寻找比基准数小的数
        }
    }
    //把基准数放到i的位置
    sort[i] = baseval;
    //递归
    QuickSort(sort,start,i - 1);  //快速排序基准数之前的
    QuickSort(sort,i + 1,end);    //快速排序基准数之后的
}